

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readCStyleComment(OurReader *this,bool *containsNewLineResult)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  *containsNewLineResult = false;
  pcVar2 = this->end_;
  pcVar4 = this->current_;
  do {
    while( true ) {
      pcVar3 = pcVar4 + 1;
      if (pcVar2 <= pcVar3) goto LAB_006f8c6f;
      this->current_ = pcVar3;
      cVar1 = *pcVar4;
      pcVar4 = pcVar3;
      if (cVar1 != '\n') break;
      *containsNewLineResult = true;
    }
  } while ((cVar1 != '*') || (*pcVar3 != '/'));
LAB_006f8c6f:
  if (pcVar4 == pcVar2) {
    return false;
  }
  this->current_ = pcVar4 + 1;
  return *pcVar4 == '/';
}

Assistant:

bool OurReader::readCStyleComment(bool* containsNewLineResult) {
  *containsNewLineResult = false;

  while ((current_ + 1) < end_) {
    Char c = getNextChar();
    if (c == '*' && *current_ == '/')
      break;
    if (c == '\n')
      *containsNewLineResult = true;
  }

  return getNextChar() == '/';
}